

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extralev.c
# Opt level: O0

void roguecorr(level *lev,int x,int y,int dir)

{
  char cVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint local_2c;
  uint local_28;
  int toy;
  int tox;
  int fromy;
  int fromx;
  int dir_local;
  int y_local;
  int x_local;
  level *lev_local;
  
  if (dir == 2) {
    r[x][y].doortable = r[x][y].doortable & 0xfd;
    if (r[x][y].real == '\0') {
      tox = x * 0x1a + 1 + (int)r[x][y].rlx;
      toy = y * 7 + (int)r[x][y].rly;
    }
    else {
      cVar1 = r[x][y].rlx;
      iVar5 = rn2((int)r[x][y].dx);
      tox = x * 0x1a + 1 + cVar1 + iVar5;
      uVar4 = y * 7 + (int)r[x][y].rly + (int)r[x][y].dy;
      if ((lev->locations[tox][(int)uVar4].typ == '\0') ||
         ('\f' < lev->locations[tox][(int)uVar4].typ)) {
        impossible("down: no wall at %d,%d?",(ulong)(uint)tox,(ulong)uVar4);
      }
      dodoor(lev,tox,uVar4,lev->rooms + r[x][y].nroom);
      *(uint *)&lev->locations[tox][(int)uVar4].field_0x6 =
           *(uint *)&lev->locations[tox][(int)uVar4].field_0x6 & 0xfffffe0f;
      toy = uVar4 + 1;
    }
    if (y < 2) {
      iVar5 = y + 1;
      r[x][iVar5].doortable = r[x][iVar5].doortable & 0xfe;
      if (r[x][iVar5].real == '\0') {
        local_28 = x * 0x1a + 1 + (int)r[x][iVar5].rlx;
        local_2c = iVar5 * 7 + (int)r[x][iVar5].rly;
      }
      else {
        cVar1 = r[x][iVar5].rlx;
        iVar6 = rn2((int)r[x][iVar5].dx);
        local_28 = x * 0x1a + 1 + cVar1 + iVar6;
        local_2c = iVar5 * 7 + r[x][iVar5].rly + -1;
        if ((lev->locations[(int)local_28][(int)local_2c].typ == '\0') ||
           ('\f' < lev->locations[(int)local_28][(int)local_2c].typ)) {
          impossible("up: no wall at %d,%d?",(ulong)local_28,(ulong)local_2c);
        }
        dodoor(lev,local_28,local_2c,lev->rooms + r[x][iVar5].nroom);
        *(uint *)&lev->locations[(int)local_28][(int)local_2c].field_0x6 =
             *(uint *)&lev->locations[(int)local_28][(int)local_2c].field_0x6 & 0xfffffe0f;
        local_2c = local_2c - 1;
      }
      roguejoin(lev,tox,toy,local_28,local_2c,0);
    }
    else {
      impossible("down door from %d,%d going nowhere?",(ulong)(uint)x,(ulong)(uint)y);
    }
  }
  else if (dir == 8) {
    r[x][y].doortable = r[x][y].doortable & 0xf7;
    if (r[x][y].real == '\0') {
      tox = x * 0x1a + 1 + (int)r[x][y].rlx;
      toy = y * 7 + (int)r[x][y].rly;
    }
    else {
      cVar1 = r[x][y].rlx;
      cVar3 = r[x][y].dx;
      cVar2 = r[x][y].rly;
      iVar5 = rn2((int)r[x][y].dy);
      uVar4 = x * 0x1a + 1 + (int)cVar1 + (int)cVar3;
      toy = y * 7 + cVar2 + iVar5;
      if ((lev->locations[(int)uVar4][toy].typ == '\0') ||
         ('\f' < lev->locations[(int)uVar4][toy].typ)) {
        impossible("down: no wall at %d,%d?",(ulong)uVar4,(ulong)(uint)toy);
      }
      dodoor(lev,uVar4,toy,lev->rooms + r[x][y].nroom);
      *(uint *)&lev->locations[(int)uVar4][toy].field_0x6 =
           *(uint *)&lev->locations[(int)uVar4][toy].field_0x6 & 0xfffffe0f;
      tox = uVar4 + 1;
    }
    if (x < 2) {
      iVar5 = x + 1;
      r[iVar5][y].doortable = r[iVar5][y].doortable & 0xfb;
      if (r[iVar5][y].real == '\0') {
        local_28 = iVar5 * 0x1a + 1 + (int)r[iVar5][y].rlx;
        local_2c = y * 7 + (int)r[iVar5][y].rly;
      }
      else {
        cVar1 = r[iVar5][y].rlx;
        cVar3 = r[iVar5][y].rly;
        iVar6 = rn2((int)r[iVar5][y].dy);
        local_28 = iVar5 * 0x1a + (int)cVar1;
        local_2c = y * 7 + cVar3 + iVar6;
        if ((lev->locations[(int)local_28][(int)local_2c].typ == '\0') ||
           ('\f' < lev->locations[(int)local_28][(int)local_2c].typ)) {
          impossible("left: no wall at %d,%d?",(ulong)local_28,(ulong)local_2c);
        }
        dodoor(lev,local_28,local_2c,lev->rooms + r[iVar5][y].nroom);
        *(uint *)&lev->locations[(int)local_28][(int)local_2c].field_0x6 =
             *(uint *)&lev->locations[(int)local_28][(int)local_2c].field_0x6 & 0xfffffe0f;
        local_28 = local_28 - 1;
      }
      roguejoin(lev,tox,toy,local_28,local_2c,1);
    }
    else {
      impossible("right door from %d,%d going nowhere?",(ulong)(uint)x,(ulong)(uint)y);
    }
  }
  else {
    impossible("corridor in direction %d?",(ulong)(uint)dir);
  }
  return;
}

Assistant:

static void roguecorr(struct level *lev, int x, int y, int dir)
{
	int fromx, fromy, tox, toy;

	if (dir==DOWN) {
		r[x][y].doortable &= ~DOWN;
		if (!r[x][y].real) {
			fromx = r[x][y].rlx; fromy = r[x][y].rly;
			fromx += 1 + 26*x; fromy += 7*y;
		} else {
			fromx = r[x][y].rlx + rn2(r[x][y].dx);
			fromy = r[x][y].rly + r[x][y].dy;
			fromx += 1 + 26*x; fromy += 7*y;
			if (!IS_WALL(lev->locations[fromx][fromy].typ))
				impossible("down: no wall at %d,%d?",fromx,
									fromy);
			dodoor(lev, fromx, fromy, &lev->rooms[r[x][y].nroom]);
			lev->locations[fromx][fromy].doormask = D_NODOOR;
			fromy++;
		}
		if (y >= 2) {
			impossible("down door from %d,%d going nowhere?",x,y);
			return;
		}
		y++;
		r[x][y].doortable &= ~UP;
		if (!r[x][y].real) {
			tox = r[x][y].rlx; toy = r[x][y].rly;
			tox += 1 + 26*x; toy += 7*y;
		} else {
			tox = r[x][y].rlx + rn2(r[x][y].dx);
			toy = r[x][y].rly - 1;
			tox += 1 + 26*x; toy += 7*y;
			if (!IS_WALL(lev->locations[tox][toy].typ))
				impossible("up: no wall at %d,%d?",tox,toy);
			dodoor(lev, tox, toy, &lev->rooms[r[x][y].nroom]);
			lev->locations[tox][toy].doormask = D_NODOOR;
			toy--;
		}
		roguejoin(lev, fromx, fromy, tox, toy, FALSE);
		return;
	} else if (dir == RIGHT) {
		r[x][y].doortable &= ~RIGHT;
		if (!r[x][y].real) {
			fromx = r[x][y].rlx; fromy = r[x][y].rly;
			fromx += 1 + 26*x; fromy += 7*y;
		} else {
			fromx = r[x][y].rlx + r[x][y].dx;
			fromy = r[x][y].rly + rn2(r[x][y].dy);
			fromx += 1 + 26*x; fromy += 7*y;
			if (!IS_WALL(lev->locations[fromx][fromy].typ))
				impossible("down: no wall at %d,%d?",fromx,
									fromy);
			dodoor(lev, fromx, fromy, &lev->rooms[r[x][y].nroom]);
			lev->locations[fromx][fromy].doormask = D_NODOOR;
			fromx++;
		}
		if (x >= 2) {
			impossible("right door from %d,%d going nowhere?",x,y);
			return;
		}
		x++;
		r[x][y].doortable &= ~LEFT;
		if (!r[x][y].real) {
			tox = r[x][y].rlx; toy = r[x][y].rly;
			tox += 1 + 26*x; toy += 7*y;
		} else {
			tox = r[x][y].rlx - 1;
			toy = r[x][y].rly + rn2(r[x][y].dy);
			tox += 1 + 26*x; toy += 7*y;
			if (!IS_WALL(lev->locations[tox][toy].typ))
				impossible("left: no wall at %d,%d?",tox,toy);
			dodoor(lev, tox, toy, &lev->rooms[r[x][y].nroom]);
			lev->locations[tox][toy].doormask = D_NODOOR;
			tox--;
		}
		roguejoin(lev, fromx, fromy, tox, toy, TRUE);
		return;
	} else impossible("corridor in direction %d?",dir);
}